

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  Fts5Tokenizer *__dest;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  
  if ((nArg & 1U) == 0) {
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      __dest = (Fts5Tokenizer *)sqlite3Malloc(0x80);
    }
    else {
      __dest = (Fts5Tokenizer *)0x0;
    }
    iVar4 = 0;
    if (__dest == (Fts5Tokenizer *)0x0) {
      iVar4 = 7;
    }
    else {
      *(undefined8 *)(__dest + 0x70) = 0;
      *(undefined8 *)(__dest + 0x78) = 0;
      *(undefined8 *)(__dest + 0x60) = 0;
      *(undefined8 *)(__dest + 0x68) = 0;
      *(undefined8 *)(__dest + 0x50) = 0;
      *(undefined8 *)(__dest + 0x58) = 0;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined8 *)(__dest + 0x48) = 0;
      *(undefined8 *)(__dest + 0x30) = 0;
      *(undefined8 *)(__dest + 0x38) = 0;
      *(undefined8 *)(__dest + 0x20) = 0;
      *(undefined8 *)(__dest + 0x28) = 0;
      *(undefined8 *)(__dest + 0x10) = 0;
      *(undefined8 *)(__dest + 0x18) = 0;
      *(undefined8 *)__dest = 0;
      *(undefined8 *)(__dest + 8) = 0;
      memcpy(__dest,aAsciiTokenChar,0x80);
      if (0 < nArg) {
        lVar5 = 0;
LAB_001f4a0c:
        pcVar2 = azArg[lVar5];
        iVar4 = 1;
        if (pcVar2 != (char *)0x0) {
          pbVar6 = (byte *)azArg[lVar5 + 1];
          lVar7 = 0;
          do {
            bVar1 = pcVar2[lVar7];
            if (bVar1 == "tokenchars"[lVar7]) {
              if ((ulong)bVar1 == 0) goto LAB_001f4a4c;
            }
            else if (""[bVar1] != ""[(byte)"tokenchars"[lVar7]]) {
              if (pcVar2 == (char *)0x0) break;
              lVar7 = 0;
              goto LAB_001f4a80;
            }
            lVar7 = lVar7 + 1;
          } while( true );
        }
LAB_001f4aa5:
        bVar3 = false;
        goto LAB_001f4aa8;
      }
      bVar3 = true;
LAB_001f4af2:
      if (bVar3) goto LAB_001f4b02;
      sqlite3_free(__dest);
    }
  }
  else {
    iVar4 = 1;
  }
  __dest = (Fts5Tokenizer *)0x0;
LAB_001f4b02:
  *ppOut = __dest;
  return iVar4;
LAB_001f4a80:
  bVar1 = pcVar2[lVar7];
  if (bVar1 == "separators"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001f4abb;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar7]]) goto LAB_001f4aa5;
  lVar7 = lVar7 + 1;
  goto LAB_001f4a80;
LAB_001f4abb:
  bVar1 = *pbVar6;
  while( true ) {
    bVar3 = true;
    iVar4 = 0;
    if (bVar1 == 0) break;
    pbVar6 = pbVar6 + 1;
    if (-1 < (char)bVar1) {
      __dest[bVar1] = (Fts5Tokenizer)0x0;
    }
    bVar1 = *pbVar6;
  }
  goto LAB_001f4aa8;
LAB_001f4a4c:
  bVar3 = true;
  bVar1 = *pbVar6;
  while (iVar4 = 0, bVar1 != 0) {
    pbVar6 = pbVar6 + 1;
    if (-1 < (char)bVar1) {
      __dest[bVar1] = (Fts5Tokenizer)0x1;
    }
    bVar1 = *pbVar6;
  }
LAB_001f4aa8:
  if ((!bVar3) || (lVar5 = lVar5 + 2, nArg <= (int)lVar5)) goto LAB_001f4af2;
  goto LAB_001f4a0c;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}